

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall
ON_Material::MaterialChannelIndexFromId(ON_Material *this,ON_UUID material_channel_id)

{
  bool bVar1;
  uint uVar2;
  ON_UuidIndex *pOVar3;
  ON_UuidIndex *a1;
  ON_UuidIndex *a;
  uint count;
  ON_Material *this_local;
  ON_UUID material_channel_id_local;
  
  material_channel_id_local._0_8_ = material_channel_id.Data4;
  register0x00000030 = material_channel_id._0_8_;
  bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)((long)&this_local + 4));
  if ((!bVar1) &&
     (uVar2 = ON_SimpleArray<ON_UuidIndex>::UnsignedCount(&this->m_material_channel), uVar2 != 0)) {
    a1 = ON_SimpleArray<ON_UuidIndex>::Array(&this->m_material_channel);
    pOVar3 = a1 + uVar2;
    for (; a1 < pOVar3; a1 = a1 + 1) {
      bVar1 = ::operator==((ON_UUID_struct *)((long)&this_local + 4),&a1->m_id);
      if (bVar1) {
        return a1->m_i;
      }
    }
  }
  return 0;
}

Assistant:

int ON_Material::MaterialChannelIndexFromId(
  ON_UUID material_channel_id
) const
{
  for (;;)
  {
    if (ON_nil_uuid == material_channel_id)
      break;
    const unsigned count = m_material_channel.UnsignedCount();
    if (0 == count)
      break;
    const ON_UuidIndex* a = m_material_channel.Array();
    for ( const ON_UuidIndex* a1 = a + count; a < a1; ++a)
    {
      if (material_channel_id == a->m_id)
        return a->m_i;
    }
    break;
  }

  return 0;
}